

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Hospital.cpp
# Opt level: O0

void __thiscall
Hospital::Remove_Doctor
          (Hospital *this,vector<Doctor,_std::allocator<Doctor>_> *All_Of_Doctors,string *id)

{
  string *this_00;
  __type _Var1;
  ulong uVar2;
  size_type sVar3;
  reference this_01;
  reference __lhs;
  __normal_iterator<Doctor_*,_std::vector<Doctor,_std::allocator<Doctor>_>_> local_58;
  __normal_iterator<Doctor_*,_std::vector<Doctor,_std::allocator<Doctor>_>_> local_50;
  const_iterator local_48;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_40;
  int local_24;
  string *psStack_20;
  int i;
  string *id_local;
  vector<Doctor,_std::allocator<Doctor>_> *All_Of_Doctors_local;
  Hospital *this_local;
  
  local_24 = 0;
  psStack_20 = id;
  id_local = (string *)All_Of_Doctors;
  All_Of_Doctors_local = (vector<Doctor,_std::allocator<Doctor>_> *)this;
  while( true ) {
    uVar2 = (ulong)local_24;
    sVar3 = std::vector<Doctor,_std::allocator<Doctor>_>::size
                      ((vector<Doctor,_std::allocator<Doctor>_> *)id_local);
    if (sVar3 <= uVar2) {
      return;
    }
    this_01 = std::vector<Doctor,_std::allocator<Doctor>_>::operator[]
                        ((vector<Doctor,_std::allocator<Doctor>_> *)id_local,(long)local_24);
    Doctor::doctor_all_ino_getter_abi_cxx11_(&local_40,this_01);
    __lhs = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::operator[](&local_40,0);
    _Var1 = std::operator==(__lhs,id);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_40);
    this_00 = id_local;
    if (_Var1) break;
    local_24 = local_24 + 1;
  }
  local_58._M_current =
       (Doctor *)
       std::vector<Doctor,_std::allocator<Doctor>_>::begin
                 ((vector<Doctor,_std::allocator<Doctor>_> *)id_local);
  local_50 = __gnu_cxx::__normal_iterator<Doctor_*,_std::vector<Doctor,_std::allocator<Doctor>_>_>::
             operator+(&local_58,(long)local_24);
  __gnu_cxx::__normal_iterator<Doctor_const*,std::vector<Doctor,std::allocator<Doctor>>>::
  __normal_iterator<Doctor*>
            ((__normal_iterator<Doctor_const*,std::vector<Doctor,std::allocator<Doctor>>> *)
             &local_48,&local_50);
  std::vector<Doctor,_std::allocator<Doctor>_>::erase
            ((vector<Doctor,_std::allocator<Doctor>_> *)this_00,local_48);
  return;
}

Assistant:

void Hospital :: Remove_Doctor(vector<Doctor> &All_Of_Doctors, string id){

    for (int i = 0; i <All_Of_Doctors.size() ; ++i) {
        if(All_Of_Doctors[i].doctor_all_ino_getter()[0] == id){
            All_Of_Doctors.erase(All_Of_Doctors.begin()+i);
            ///remove from files
            break;
        }
    }
}